

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O3

void Saig_ManUnrollCollect_rec(Aig_Man_t *pAig,Aig_Obj_t *pObj,Vec_Int_t *vObjs,Vec_Int_t *vRoots)

{
  uint uVar1;
  long lVar2;
  
  if (pObj->TravId == pAig->nTravIds) {
    return;
  }
  pObj->TravId = pAig->nTravIds;
  uVar1 = (uint)*(undefined8 *)&pObj->field_0x18;
  lVar2 = 8;
  if ((uVar1 & 7) != 3) {
    if ((uVar1 & 7) - 7 < 0xfffffffe) goto LAB_0061a9bf;
    Saig_ManUnrollCollect_rec
              (pAig,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vObjs,vRoots);
    lVar2 = 0x10;
  }
  Saig_ManUnrollCollect_rec
            (pAig,(Aig_Obj_t *)(*(ulong *)((long)&pObj->field_0 + lVar2) & 0xfffffffffffffffe),vObjs
             ,vRoots);
LAB_0061a9bf:
  if (((vRoots != (Vec_Int_t *)0x0) && ((*(uint *)&pObj->field_0x18 & 7) == 2)) &&
     (pAig->nTruePis <= (pObj->field_0).CioId)) {
    uVar1 = ((pObj->field_0).CioId - pAig->nTruePis) + pAig->nTruePos;
    if (((int)uVar1 < 0) || (pAig->vCos->nSize <= (int)uVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    Vec_IntPush(vRoots,*(int *)((long)pAig->vCos->pArray[uVar1] + 0x24));
  }
  Vec_IntPush(vObjs,pObj->Id);
  return;
}

Assistant:

void Saig_ManUnrollCollect_rec( Aig_Man_t * pAig, Aig_Obj_t * pObj, Vec_Int_t * vObjs, Vec_Int_t * vRoots )
{
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(pAig, pObj);
    if ( Aig_ObjIsCo(pObj) )
        Saig_ManUnrollCollect_rec( pAig, Aig_ObjFanin0(pObj), vObjs, vRoots );
    else if ( Aig_ObjIsNode(pObj) )
    {
        Saig_ManUnrollCollect_rec( pAig, Aig_ObjFanin0(pObj), vObjs, vRoots );
        Saig_ManUnrollCollect_rec( pAig, Aig_ObjFanin1(pObj), vObjs, vRoots );
    }
    if ( vRoots && Saig_ObjIsLo( pAig, pObj ) )
        Vec_IntPush( vRoots, Aig_ObjId( Saig_ObjLoToLi(pAig, pObj) ) );
    Vec_IntPush( vObjs, Aig_ObjId(pObj) );
}